

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_new.cc
# Opt level: O3

int ASN1_template_new(ASN1_VALUE **pval,ASN1_TEMPLATE *tt)

{
  byte bVar1;
  ASN1_ITEM *it;
  ulong uVar2;
  int iVar3;
  OPENSSL_STACK *pOVar4;
  
  uVar2 = tt->flags;
  if ((uVar2 & 1) == 0) {
    if ((uVar2 & 0x300) == 0) {
      if ((uVar2 & 6) == 0) {
        iVar3 = ASN1_item_ex_new(pval,(ASN1_ITEM *)tt->field_name);
        return iVar3;
      }
      pOVar4 = OPENSSL_sk_new_null();
      if (pOVar4 == (OPENSSL_STACK *)0x0) {
        return 0;
      }
      *pval = (ASN1_VALUE *)pOVar4;
    }
    else {
LAB_00207d8d:
      *pval = (ASN1_VALUE *)0x0;
    }
  }
  else {
    do {
      if ((tt->flags & 0x306) != 0) goto LAB_00207d8d;
      it = (ASN1_ITEM *)tt->field_name;
      bVar1 = it->itype;
      if (bVar1 != 0) {
        if (bVar1 - 1 < 2) goto LAB_00207d8d;
        if (bVar1 != 5) {
          if (bVar1 != 4) {
            return 1;
          }
          goto LAB_00207d8d;
        }
        break;
      }
      tt = (ASN1_TEMPLATE *)it->templates;
    } while (tt != (ASN1_TEMPLATE *)0x0);
    asn1_primitive_clear((ASN1_VALUE **)pval,it);
  }
  return 1;
}

Assistant:

static int ASN1_template_new(ASN1_VALUE **pval, const ASN1_TEMPLATE *tt) {
  const ASN1_ITEM *it = ASN1_ITEM_ptr(tt->item);
  int ret;
  if (tt->flags & ASN1_TFLG_OPTIONAL) {
    asn1_template_clear(pval, tt);
    return 1;
  }
  // If ANY DEFINED BY nothing to do

  if (tt->flags & ASN1_TFLG_ADB_MASK) {
    *pval = NULL;
    return 1;
  }
  // If SET OF or SEQUENCE OF, its a STACK
  if (tt->flags & ASN1_TFLG_SK_MASK) {
    STACK_OF(ASN1_VALUE) *skval;
    skval = sk_ASN1_VALUE_new_null();
    if (!skval) {
      ret = 0;
      goto done;
    }
    *pval = (ASN1_VALUE *)skval;
    ret = 1;
    goto done;
  }
  // Otherwise pass it back to the item routine
  ret = ASN1_item_ex_new(pval, it);
done:
  return ret;
}